

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O1

Matrix6x6 * __thiscall iDynTree::SpatialInertia::asMatrix(SpatialInertia *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  long lVar6;
  Matrix6x6 *in_RDI;
  double dVar7;
  
  dVar3 = this->m_mass;
  in_RDI->m_data[0] = dVar3;
  dVar7 = dVar3 * 0.0;
  in_RDI->m_data[1] = dVar7;
  in_RDI->m_data[2] = dVar7;
  in_RDI->m_data[6] = dVar7;
  in_RDI->m_data[7] = dVar3;
  in_RDI->m_data[8] = dVar7;
  in_RDI->m_data[0xc] = dVar7;
  in_RDI->m_data[0xd] = dVar7;
  in_RDI->m_data[0xe] = dVar3;
  dVar3 = this->m_mcom[2];
  dVar7 = this->m_mcom[0];
  dVar4 = this->m_mcom[1];
  in_RDI->m_data[3] = -0.0;
  in_RDI->m_data[4] = dVar3;
  in_RDI->m_data[5] = -dVar4;
  in_RDI->m_data[9] = -dVar3;
  in_RDI->m_data[10] = -0.0;
  in_RDI->m_data[0xb] = dVar7;
  in_RDI->m_data[0xf] = dVar4;
  in_RDI->m_data[0x10] = -dVar7;
  in_RDI->m_data[0x11] = -0.0;
  in_RDI->m_data[0x12] = 0.0;
  in_RDI->m_data[0x13] = -dVar3;
  in_RDI->m_data[0x14] = dVar4;
  in_RDI->m_data[0x18] = dVar3;
  lVar6 = 0;
  in_RDI->m_data[0x19] = 0.0;
  in_RDI->m_data[0x1a] = -dVar7;
  in_RDI->m_data[0x1e] = -dVar4;
  in_RDI->m_data[0x1f] = dVar7;
  in_RDI->m_data[0x20] = 0.0;
  do {
    puVar1 = (undefined8 *)((long)(this->m_rotInertia).super_Matrix3x3.m_data + lVar6);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)in_RDI->m_data + lVar6 * 2 + 0xa8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    *(undefined8 *)((long)in_RDI->m_data + lVar6 * 2 + 0xb8) =
         *(undefined8 *)((long)(this->m_rotInertia).super_Matrix3x3.m_data + lVar6 + 0x10);
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  return in_RDI;
}

Assistant:

Matrix6x6 SpatialInertia::asMatrix() const
{
    Matrix6x6 ret;

    // Implementing the 2.63 formula in Featherstone 2008
    // compare with ::multiply method for consistency

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > I(this->m_rotInertia.data());

    retEigen.block<3,3>(0,0) =  this->getMass()*Eigen::Matrix<double,3,3,Eigen::RowMajor>::Identity();
    retEigen.block<3,3>(0,3) = -mySkewIn(mcom);
    retEigen.block<3,3>(3,0) = mySkewIn(mcom);
    retEigen.block<3,3>(3,3) = I;

    return ret;
}